

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O0

bool __thiscall
llvm::DWARFDebugLine::Prologue::getFileNameByIndex
          (Prologue *this,uint64_t FileIndex,StringRef CompDir,FileLineInfoKind Kind,string *Result,
          Style Style)

{
  ulong uVar1;
  bool bVar2;
  uint16_t uVar3;
  char **ppcVar4;
  size_type sVar5;
  const_reference pvVar6;
  Optional<const_char_*> OVar7;
  byte local_27a;
  bool local_231;
  StringRef local_228;
  string local_218;
  Twine local_1f8;
  Twine local_1e0;
  Twine local_1c8;
  Twine local_1b0;
  Twine local_198;
  Twine local_180;
  Twine local_168;
  Twine local_150;
  Twine local_138;
  anon_union_8_2_fc7899a5_for_OptionalStorage<const_char_*,_true>_2 local_120;
  undefined1 local_118;
  StringRef local_110;
  anon_union_8_2_fc7899a5_for_OptionalStorage<const_char_*,_true>_2 local_100;
  undefined1 local_f8;
  StringRef local_f0 [2];
  undefined1 local_d0 [8];
  StringRef IncludeDir;
  SmallString<16U> FilePath;
  Twine local_80;
  anon_union_8_2_fc7899a5_for_OptionalStorage<const_char_*,_true>_2 local_68;
  undefined1 local_60;
  undefined1 local_58 [8];
  StringRef FileName;
  FileNameEntry *Entry;
  string *Result_local;
  FileLineInfoKind Kind_local;
  uint64_t FileIndex_local;
  Prologue *this_local;
  StringRef CompDir_local;
  
  CompDir_local.Data = (char *)CompDir.Length;
  this_local = (Prologue *)CompDir.Data;
  if ((Kind == None) || (bVar2 = hasFileAtIndex(this,FileIndex), !bVar2)) {
    CompDir_local.Length._7_1_ = 0;
  }
  else {
    FileName.Length = (size_t)getFileNameEntry(this,FileIndex);
    OVar7 = DWARFFormValue::getAsCString((DWARFFormValue *)FileName.Length);
    local_68 = OVar7.Storage.field_0;
    local_60 = OVar7.Storage.hasVal;
    ppcVar4 = Optional<const_char_*>::getValue((Optional<const_char_*> *)&local_68);
    StringRef::StringRef((StringRef *)local_58,*ppcVar4);
    local_231 = true;
    if (Kind == AbsoluteFilePath) {
      Twine::Twine(&local_80,(StringRef *)local_58);
      local_231 = isPathAbsoluteOnWindowsOrPosix(&local_80);
    }
    if (local_231 == false) {
      SmallString<16U>::SmallString((SmallString<16U> *)&IncludeDir.Length);
      StringRef::StringRef((StringRef *)local_d0);
      uVar3 = getVersion(this);
      if (uVar3 < 5) {
        if ((*(long *)(FileName.Length + 0x30) != 0) &&
           (uVar1 = *(ulong *)(FileName.Length + 0x30),
           sVar5 = std::vector<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>::size
                             (&this->IncludeDirectories), uVar1 <= sVar5)) {
          pvVar6 = std::vector<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>::
                   operator[](&this->IncludeDirectories,*(long *)(FileName.Length + 0x30) - 1);
          OVar7 = DWARFFormValue::getAsCString(pvVar6);
          local_120 = OVar7.Storage.field_0;
          local_118 = OVar7.Storage.hasVal;
          ppcVar4 = Optional<const_char_*>::getValue((Optional<const_char_*> *)&local_120);
          StringRef::StringRef(&local_110,*ppcVar4);
          local_d0 = (undefined1  [8])local_110.Data;
          IncludeDir.Data = (char *)local_110.Length;
        }
        bVar2 = StringRef::empty((StringRef *)&this_local);
        local_27a = 0;
        if (!bVar2) {
          Twine::Twine(&local_138,(StringRef *)local_d0);
          bVar2 = isPathAbsoluteOnWindowsOrPosix(&local_138);
          local_27a = bVar2 ^ 0xff;
        }
        if ((local_27a & 1) != 0) {
          Twine::Twine(&local_150,(StringRef *)&this_local);
          Twine::Twine(&local_168,"");
          Twine::Twine(&local_180,"");
          Twine::Twine(&local_198,"");
          sys::path::append((SmallVectorImpl<char> *)&IncludeDir.Length,Style,&local_150,&local_168,
                            &local_180,&local_198);
        }
      }
      else {
        uVar1 = *(ulong *)(FileName.Length + 0x30);
        sVar5 = std::vector<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>::size
                          (&this->IncludeDirectories);
        if (uVar1 < sVar5) {
          pvVar6 = std::vector<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>::
                   operator[](&this->IncludeDirectories,*(size_type *)(FileName.Length + 0x30));
          OVar7 = DWARFFormValue::getAsCString(pvVar6);
          local_100 = OVar7.Storage.field_0;
          local_f8 = OVar7.Storage.hasVal;
          ppcVar4 = Optional<const_char_*>::getValue((Optional<const_char_*> *)&local_100);
          StringRef::StringRef(local_f0,*ppcVar4);
          local_d0 = (undefined1  [8])local_f0[0].Data;
          IncludeDir.Data = (char *)local_f0[0].Length;
        }
      }
      Twine::Twine(&local_1b0,(StringRef *)local_d0);
      Twine::Twine(&local_1c8,(StringRef *)local_58);
      Twine::Twine(&local_1e0,"");
      Twine::Twine(&local_1f8,"");
      sys::path::append((SmallVectorImpl<char> *)&IncludeDir.Length,Style,&local_1b0,&local_1c8,
                        &local_1e0,&local_1f8);
      local_228 = SmallString<16U>::str((SmallString<16U> *)&IncludeDir.Length);
      StringRef::operator_cast_to_string(&local_218,&local_228);
      std::__cxx11::string::operator=((string *)Result,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      CompDir_local.Length._7_1_ = 1;
      SmallString<16U>::~SmallString((SmallString<16U> *)&IncludeDir.Length);
    }
    else {
      StringRef::operator_cast_to_string
                ((string *)
                 (FilePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.
                  InlineElts + 8),(StringRef *)local_58);
      std::__cxx11::string::operator=
                ((string *)Result,
                 (string *)
                 (FilePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.
                  InlineElts + 8));
      std::__cxx11::string::~string
                ((string *)
                 (FilePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.
                  InlineElts + 8));
      CompDir_local.Length._7_1_ = 1;
    }
  }
  return (bool)(CompDir_local.Length._7_1_ & 1);
}

Assistant:

bool DWARFDebugLine::Prologue::getFileNameByIndex(
    uint64_t FileIndex, StringRef CompDir, FileLineInfoKind Kind,
    std::string &Result, sys::path::Style Style) const {
  if (Kind == FileLineInfoKind::None || !hasFileAtIndex(FileIndex))
    return false;
  const FileNameEntry &Entry = getFileNameEntry(FileIndex);
  StringRef FileName = Entry.Name.getAsCString().getValue();
  if (Kind != FileLineInfoKind::AbsoluteFilePath ||
      isPathAbsoluteOnWindowsOrPosix(FileName)) {
    Result = FileName;
    return true;
  }

  SmallString<16> FilePath;
  StringRef IncludeDir;
  // Be defensive about the contents of Entry.
  if (getVersion() >= 5) {
    if (Entry.DirIdx < IncludeDirectories.size())
      IncludeDir = IncludeDirectories[Entry.DirIdx].getAsCString().getValue();
  } else {
    if (0 < Entry.DirIdx && Entry.DirIdx <= IncludeDirectories.size())
      IncludeDir =
          IncludeDirectories[Entry.DirIdx - 1].getAsCString().getValue();

    // We may still need to append compilation directory of compile unit.
    // We know that FileName is not absolute, the only way to have an
    // absolute path at this point would be if IncludeDir is absolute.
    if (!CompDir.empty() && !isPathAbsoluteOnWindowsOrPosix(IncludeDir))
      sys::path::append(FilePath, Style, CompDir);
  }

  // sys::path::append skips empty strings.
  sys::path::append(FilePath, Style, IncludeDir, FileName);
  Result = FilePath.str();
  return true;
}